

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.h
# Opt level: O2

void gimage::imageToGrey<float>
               (Image<float,_gimage::PixelTraits<float>_> *ret,
               Image<float,_gimage::PixelTraits<float>_> *image)

{
  float ***pppfVar1;
  float ***pppfVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long i;
  long lVar6;
  float fVar7;
  
  Image<float,_gimage::PixelTraits<float>_>::setSize(ret,image->width,image->height,1);
  lVar4 = 0;
  lVar3 = image->width;
  if (image->width < 1) {
    lVar3 = lVar4;
  }
  lVar5 = image->height;
  if (image->height < 1) {
    lVar5 = lVar4;
  }
  for (; lVar4 != lVar5; lVar4 = lVar4 + 1) {
    pppfVar1 = image->img;
    pppfVar2 = ret->img;
    for (lVar6 = 0; lVar3 != lVar6; lVar6 = lVar6 + 1) {
      fVar7 = INFINITY;
      if ((((uint)ABS((*pppfVar1)[lVar4][lVar6]) < 0x7f800000) &&
          (fVar7 = INFINITY, (uint)ABS(pppfVar1[1][lVar4][lVar6]) < 0x7f800000)) &&
         (fVar7 = INFINITY, (uint)ABS(pppfVar1[2][lVar4][lVar6]) < 0x7f800000)) {
        fVar7 = (pppfVar1[2][lVar4][lVar6] * 3736.0 +
                (*pppfVar1)[lVar4][lVar6] * 9798.0 + pppfVar1[1][lVar4][lVar6] * 19234.0) *
                3.0517578e-05;
      }
      (*pppfVar2)[lVar4][lVar6] = fVar7;
    }
  }
  return;
}

Assistant:

inline void imageToGrey<float>(Image<float> &ret, const Image<float> &image)
{
  float red, green, blue;

  assert(image.getDepth() == 3);

  ret.setSize(image.getWidth(), image.getHeight(), 1);

  for (long k=0; k<image.getHeight(); k++)
  {
    for (long i=0; i<image.getWidth(); i++)
    {
      red=image.get(i, k, 0);
      green=image.get(i, k, 1);
      blue=image.get(i, k, 2);

      if (image.isValidS(red) && image.isValidS(green) && image.isValidS(blue))
      {
        ret.setLimited(i, k, 0, (9798*red+19234*green+3736*blue)/32768);
      }
      else
      {
        ret.setInvalid(i, k, 0);
      }
    }
  }
}